

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.hpp
# Opt level: O1

void de::cmdline::detail::dispatchSetDefault<tcu::opt::CrashHandler>(TypedFieldMap *dst)

{
  bool *dst_00;
  Entry local_20;
  
  dst_00 = (bool *)operator_new(1);
  *dst_00 = false;
  getTypeDefault<bool>(dst_00);
  local_20.destructor = TypedFieldValueTraits<bool>::destroy;
  local_20.value = dst_00;
  TypedFieldMap::set(dst,(type_info *)&tcu::opt::CrashHandler::typeinfo,&local_20);
  return;
}

Assistant:

void dispatchSetDefault (TypedFieldMap* dst)
{
	typename OptTraits<OptType>::ValueType* value = new typename OptTraits<OptType>::ValueType();
	try
	{
		getTypeDefault<typename OptTraits<OptType>::ValueType>(value);
		dst->set<OptType>(value);
	}
	catch (...)
	{
		delete value;
		throw;
	}
}